

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::AddChild<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (Node *this,string *name,vector<unsigned_char,_std::allocator<unsigned_char>_> *more)

{
  Node c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_98;
  undefined1 local_80 [112];
  
  Node((Node *)local_80,name);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_98,more);
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)(local_80 + 0x20),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_98);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_80);
  ~Node((Node *)local_80);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }